

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::internal::anon_unknown_91::SplitEscapedString
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  long in_FS_OFFSET;
  bool bVar2;
  size_t local_88;
  size_t i;
  ulong uStack_78;
  bool escaped;
  size_t end;
  size_t start;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  value_type local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  end = 0;
  uStack_78 = std::__cxx11::string::size();
  if (((2 < uStack_78) &&
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar1 == '\"')) &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str), *pcVar1 == '\"')) {
    end = 1;
    uStack_78 = uStack_78 - 1;
  }
  bVar2 = false;
  for (local_88 = end; local_88 + 1 < uStack_78; local_88 = local_88 + 1) {
    if (bVar2) {
      bVar2 = false;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar1 == 'n') {
        std::__cxx11::string::substr((ulong)&local_30,(ulong)str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_30);
        std::__cxx11::string::~string((string *)&local_30);
      }
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)str);
      bVar2 = *pcVar1 == '\\';
    }
  }
  std::__cxx11::string::substr((ulong)&lines,(ulong)str);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&lines);
  std::__cxx11::string::~string((string *)&lines);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<std::string> SplitEscapedString(const std::string& str) {
  std::vector<std::string> lines;
  size_t start = 0, end = str.size();
  if (end > 2 && str[0] == '"' && str[end - 1] == '"') {
    ++start;
    --end;
  }
  bool escaped = false;
  for (size_t i = start; i + 1 < end; ++i) {
    if (escaped) {
      escaped = false;
      if (str[i] == 'n') {
        lines.push_back(str.substr(start, i - start - 1));
        start = i + 1;
      }
    } else {
      escaped = str[i] == '\\';
    }
  }
  lines.push_back(str.substr(start, end - start));
  return lines;
}